

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ContinuousAssignSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ContinuousAssignSymbol,slang::syntax::ExpressionSyntax_const&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  ContinuousAssignSymbol *this_00;
  
  this_00 = (ContinuousAssignSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ContinuousAssignSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (ContinuousAssignSymbol *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::ContinuousAssignSymbol::ContinuousAssignSymbol(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }